

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

int quicly_recvbuf_receive
              (quicly_stream_t *stream,ptls_buffer_t *rb,size_t off,void *src,size_t len)

{
  int iVar1;
  ptls_buffer_t *in_RCX;
  quicly_stream_t *in_RDX;
  long *in_RSI;
  size_t in_R8;
  int ret;
  
  if (in_R8 != 0) {
    iVar1 = ptls_buffer_reserve(in_RCX,in_R8);
    if (iVar1 != 0) {
      convert_error(in_RDX,(int)((ulong)in_RCX >> 0x20));
      return -1;
    }
    memcpy((void *)((long)&in_RDX->conn + *in_RSI),in_RCX,in_R8);
    if ((ulong)in_RSI[2] < (long)&in_RDX->conn + in_R8) {
      in_RSI[2] = (long)&in_RDX->conn + in_R8;
    }
  }
  return 0;
}

Assistant:

int quicly_recvbuf_receive(quicly_stream_t *stream, ptls_buffer_t *rb, size_t off, const void *src, size_t len)
{
    if (len != 0) {
        int ret;
        if ((ret = ptls_buffer_reserve(rb, off + len - rb->off)) != 0) {
            convert_error(stream, ret);
            return -1;
        }
        memcpy(rb->base + off, src, len);
        if (rb->off < off + len)
            rb->off = off + len;
    }
    return 0;
}